

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::dumpHGeneric(QPDF *this,HGeneric *t)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  Pipeline *pPVar2;
  long i;
  QPDFLogger local_28;
  
  QPDFLogger::getInfo(&local_28,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  pPVar2 = Pipeline::operator<<
                     ((Pipeline *)
                      local_28.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"first_object: ");
  pPVar2 = Pipeline::operator<<(pPVar2,t->first_object);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"first_object_offset: ");
  i = t->first_object_offset;
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->linp + 0x30) <= i) {
    i = i + *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->linp + 0x38);
  }
  pPVar2 = Pipeline::operator<<(pPVar2,i);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"nobjects: ");
  pPVar2 = Pipeline::operator<<(pPVar2,t->nobjects);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"group_length: ");
  pPVar2 = Pipeline::operator<<(pPVar2,t->group_length);
  Pipeline::operator<<(pPVar2,"\n");
  if (local_28.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDF::dumpHGeneric(HGeneric& t)
{
    *m->log->getInfo() << "first_object: " << t.first_object << "\n"
                       << "first_object_offset: " << adjusted_offset(t.first_object_offset) << "\n"
                       << "nobjects: " << t.nobjects << "\n"
                       << "group_length: " << t.group_length << "\n";
}